

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pattern.h
# Opt level: O3

PatternView * __thiscall
ZXing::FindLeftGuard<6,bool(*)(ZXing::PatternView_const&,int)>
          (PatternView *__return_storage_ptr__,ZXing *this,PatternView *view,int minSize,
          _func_bool_PatternView_ptr_int *isGuard)

{
  char cVar1;
  Iterator puVar2;
  int iVar3;
  undefined4 in_register_0000000c;
  Iterator puVar4;
  PatternView window;
  undefined8 local_48;
  int iStack_40;
  undefined4 uStack_3c;
  Iterator local_38;
  Iterator puStack_30;
  
  iVar3 = *(int *)(this + 8);
  if ((int)view <= iVar3) {
    puVar4 = *(Iterator *)this;
    local_38 = *(Iterator *)(this + 0x10);
    puStack_30 = *(Iterator *)(this + 0x18);
    iStack_40 = 6;
    local_48 = puVar4;
    if (puVar4 == local_38 + 1) {
      cVar1 = (*(code *)CONCAT44(in_register_0000000c,minSize))(&local_48,0x7fffffff);
      if (cVar1 != '\0') {
LAB_0015c9de:
        __return_storage_ptr__->_base = local_38;
        __return_storage_ptr__->_end = puStack_30;
        goto LAB_0015ca3f;
      }
      puVar4 = *(Iterator *)this;
      iVar3 = *(int *)(this + 8);
    }
    puVar2 = local_48;
    while (puVar2 < puVar4 + ((long)iVar3 - (long)(int)view)) {
      cVar1 = (*(code *)CONCAT44(in_register_0000000c,minSize))(&local_48,puVar2[-1]);
      if (cVar1 != '\0') goto LAB_0015c9de;
      if (local_48 == (Iterator)0x0) {
        puVar2 = (Iterator)0x0;
      }
      else {
        puVar2 = local_48 + 2;
        local_48 = puVar2;
      }
    }
  }
  local_48._0_4_ = 0;
  local_48._4_4_ = 0;
  iStack_40 = 0;
  uStack_3c = 0;
  __return_storage_ptr__->_base = (Iterator)0x0;
  __return_storage_ptr__->_end = (Iterator)0x0;
LAB_0015ca3f:
  *(undefined4 *)&__return_storage_ptr__->_data = (undefined4)local_48;
  *(undefined4 *)((long)&__return_storage_ptr__->_data + 4) = local_48._4_4_;
  __return_storage_ptr__->_size = iStack_40;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = uStack_3c;
  return __return_storage_ptr__;
}

Assistant:

PatternView FindLeftGuard(const PatternView& view, int minSize, Pred isGuard)
{
	if (view.size() < minSize)
		return {};

	auto window = view.subView(0, LEN);
	if (window.isAtFirstBar() && isGuard(window, std::numeric_limits<int>::max()))
		return window;
	for (auto end = view.end() - minSize; window.data() < end; window.skipPair())
		if (isGuard(window, window[-1]))
			return window;

	return {};
}